

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O2

void z_sqrt(complex *r,complex *z)

{
  float fVar1;
  double dVar2;
  float fVar3;
  
  fVar3 = z->r;
  fVar1 = f__cabs(fVar3,z->i);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    if (fVar3 <= 0.0) {
      dVar2 = (double)(fVar1 - fVar3) * 0.5;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      fVar1 = (float)dVar2;
      r->i = fVar1;
      fVar3 = z->i;
      if (fVar3 < 0.0) {
        fVar1 = -fVar1;
        r->i = fVar1;
        fVar3 = z->i;
      }
      r->r = (fVar3 / fVar1) * 0.5;
    }
    else {
      dVar2 = (double)(fVar3 + fVar1) * 0.5;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      r->r = (float)dVar2;
      r->i = (z->i / (float)dVar2) * 0.5;
    }
  }
  else {
    r->r = 0.0;
    r->i = 0.0;
  }
  return;
}

Assistant:

void
z_sqrt(complex * r, complex * z)
#endif
{
    float mag;

    if ((mag = f__cabs(z->r, z->i)) == 0.)
        r->r = r->i = 0.;
    else if (z->r > 0) {
        r->r = sqrt(0.5 * (mag + z->r));
        r->i = z->i / r->r / 2;
    }
    else {
        r->i = sqrt(0.5 * (mag - z->r));
        if (z->i < 0)
            r->i = -r->i;
        r->r = z->i / r->i / 2;
    }
}